

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall
cfd::core::Psbt::SetTxInFinalScript
          (Psbt *this,uint32_t index,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *unlocking_script)

{
  long lVar1;
  undefined8 uVar2;
  wally_psbt *pwVar3;
  bool bVar4;
  const_reference pvVar5;
  CfdException *pCVar6;
  size_type sVar7;
  reference pBVar8;
  byte *pbVar9;
  uchar *puVar10;
  ulong uVar11;
  bool local_7f9;
  allocator local_731;
  string local_730;
  CfdSourceLocation local_710;
  Script local_6f8;
  ByteData local_6c0;
  undefined1 local_6a8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig_val_1;
  undefined1 local_678 [8];
  ScriptBuilder builder;
  Script local_640;
  undefined1 local_608 [8];
  KeyData key;
  undefined1 local_480 [8];
  Script locking_script;
  Script local_440;
  undefined1 local_402;
  allocator local_401;
  string local_400;
  CfdSourceLocation local_3e0;
  ByteData local_3c8;
  undefined1 local_3b0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig_val;
  undefined1 local_360 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val_1;
  ByteData script_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range4;
  ScriptBuilder build;
  undefined1 local_2c0 [8];
  Script script_sig;
  string local_280;
  CfdSourceLocation local_260;
  undefined1 local_242;
  allocator local_241;
  string local_240;
  CfdSourceLocation local_220;
  undefined1 local_208 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  ByteData script;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range3;
  string local_1b8;
  CfdSourceLocation local_198;
  undefined8 local_180;
  wally_tx_witness_stack *stacks;
  string local_170;
  CfdSourceLocation local_150;
  ByteData local_138;
  undefined1 local_120 [8];
  value_type last_stack;
  int ret;
  bool is_wsh;
  TxOut utxo;
  Script redeem_script;
  bool is_witness;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_40;
  void *local_28;
  wally_psbt *psbt_pointer;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *unlocking_script_local;
  Psbt *pPStack_10;
  uint32_t index_local;
  Psbt *this_local;
  
  psbt_pointer = (wally_psbt *)unlocking_script;
  unlocking_script_local._4_4_ = index;
  pPStack_10 = this;
  (*this->_vptr_Psbt[2])(this,(ulong)index,0x974,"SetTxInFinalScript");
  local_28 = this->wally_psbt_pointer_;
  bVar4 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::empty
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                     psbt_pointer);
  if (bVar4) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x979;
    local_40.funcname = "SetTxInFinalScript";
    logger::warn<>(&local_40,"unlocking script is empty.");
    redeem_script.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_60,"psbt unlocking script is empty.",&local_61);
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_60);
    redeem_script.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  redeem_script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  GetTxInRedeemScript((Script *)
                      &utxo.super_AbstractTxOut.locking_script_.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,this,
                      unlocking_script_local._4_4_,true,(bool *)0x0);
  GetTxInUtxo((TxOut *)&ret,this,unlocking_script_local._4_4_,true,
              (bool *)((long)&redeem_script.script_stack_.
                              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  if ((redeem_script.script_stack_.
       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 1) == 0) {
    Script::Script((Script *)local_2c0);
    sVar7 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                      ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                       psbt_pointer);
    if (sVar7 == 1) {
      pvVar5 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          psbt_pointer,0);
      Script::Script((Script *)
                     &build.script_byte_array_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,pvVar5);
      Script::operator=((Script *)local_2c0,
                        (Script *)
                        &build.script_byte_array_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      Script::~Script((Script *)
                      &build.script_byte_array_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    }
    else {
      ScriptBuilder::ScriptBuilder((ScriptBuilder *)&__range4);
      pwVar3 = psbt_pointer;
      __end4 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          psbt_pointer);
      script_1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end
                              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                               pwVar3);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                                         *)&script_1.data_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage),
            bVar4) {
        pBVar8 = __gnu_cxx::
                 __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                 ::operator*(&__end4);
        ByteData::ByteData((ByteData *)
                           &script_val_1.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,pBVar8);
        ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_360,
                           (ByteData *)
                           &script_val_1.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_360);
        if (sVar7 == 1) {
          pbVar9 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_360,0);
          ScriptBuilder::AppendOperator((ScriptBuilder *)&__range4,(uint)*pbVar9);
        }
        else {
          ScriptBuilder::AppendData
                    ((ScriptBuilder *)&__range4,
                     (ByteData *)
                     &script_val_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_360);
        ByteData::~ByteData((ByteData *)
                            &script_val_1.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
        ::operator++(&__end4);
      }
      ScriptBuilder::Build
                ((Script *)
                 &sig_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ScriptBuilder *)&__range4);
      Script::operator=((Script *)local_2c0,
                        (Script *)
                        &sig_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      Script::~Script((Script *)
                      &sig_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
      ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&__range4);
    }
    Script::GetData(&local_3c8,(Script *)local_2c0);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3b0,&local_3c8
                      );
    ByteData::~ByteData(&local_3c8);
    lVar1 = *(long *)((long)local_28 + 0x10);
    uVar11 = (ulong)unlocking_script_local._4_4_;
    puVar10 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3b0);
    sVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3b0);
    last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         wally_psbt_input_set_final_scriptsig(lVar1 + uVar11 * 0x110,puVar10,sVar7);
    if ((int)last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
      local_3e0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_3e0.filename = local_3e0.filename + 1;
      local_3e0.line = 0x9be;
      local_3e0.funcname = "SetTxInFinalScript";
      logger::warn<int&>(&local_3e0,"wally_psbt_input_set_final_scriptsig NG[{}]",
                         (int *)&last_stack.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_402 = 1;
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_400,"psbt set scriptsig error.",&local_401);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_400);
      local_402 = 0;
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3b0);
    Script::~Script((Script *)local_2c0);
  }
  else {
    pvVar5 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::back
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                        psbt_pointer);
    ByteData::ByteData((ByteData *)local_120,pvVar5);
    Script::GetData(&local_138,
                    (Script *)
                    &utxo.super_AbstractTxOut.locking_script_.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar4 = ByteData::Equals(&local_138,(ByteData *)local_120);
    ByteData::~ByteData(&local_138);
    if (bVar4) {
      last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
    else {
      bVar4 = Pubkey::IsValid((ByteData *)local_120);
      if (!bVar4) {
        local_150.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_150.filename = local_150.filename + 1;
        local_150.line = 0x98a;
        local_150.funcname = "SetTxInFinalScript";
        logger::warn<>(&local_150,"invalid unlocking_script.");
        stacks._6_1_ = 1;
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_170,"psbt invalid unlocking_script error.",
                   (allocator *)((long)&stacks + 7));
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_170);
        stacks._6_1_ = 0;
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    local_180 = 0;
    sVar7 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                      ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                       psbt_pointer);
    last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         wally_tx_witness_stack_init_alloc(sVar7,&local_180);
    pwVar3 = psbt_pointer;
    if ((int)last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
      local_198.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_198.filename = local_198.filename + 1;
      local_198.line = 0x992;
      local_198.funcname = "SetTxInFinalScript";
      logger::warn<int&>(&local_198,"wally_tx_witness_stack_init_alloc NG[{}]",
                         (int *)&last_stack.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      __range3._6_1_ = 1;
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_1b8,"psbt init witness stack error.",
                 (allocator *)((long)&__range3 + 7));
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_1b8);
      __range3._6_1_ = 0;
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    __end3 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin
                       ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                        psbt_pointer);
    script.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end
                            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                             pwVar3);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                                       *)&script.data_.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar4
          ) {
      pBVar8 = __gnu_cxx::
               __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
               ::operator*(&__end3);
      ByteData::ByteData((ByteData *)
                         &script_val.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,pBVar8);
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_208,
                         (ByteData *)
                         &script_val.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      uVar2 = local_180;
      puVar10 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_208);
      sVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_208);
      last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           wally_tx_witness_stack_add(uVar2,puVar10,sVar7);
      if ((int)last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
        wally_tx_witness_stack_free(local_180);
        local_220.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_220.filename = local_220.filename + 1;
        local_220.line = 0x99c;
        local_220.funcname = "SetTxInFinalScript";
        logger::warn<int&>(&local_220,"wally_tx_witness_stack_add NG[{}]",
                           (int *)&last_stack.data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_242 = 1;
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_240,"psbt add witness stack error.",&local_241);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_240);
        local_242 = 0;
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_208);
      ByteData::~ByteData((ByteData *)
                          &script_val.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
      ::operator++(&__end3);
    }
    last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         wally_psbt_input_set_final_witness
                   (*(long *)((long)local_28 + 0x10) + (ulong)unlocking_script_local._4_4_ * 0x110,
                    local_180);
    wally_tx_witness_stack_free(local_180);
    if ((int)last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
      local_260.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_260.filename = local_260.filename + 1;
      local_260.line = 0x9a6;
      local_260.funcname = "SetTxInFinalScript";
      logger::warn<int&>(&local_260,"wally_psbt_input_set_final_witness NG[{}]",
                         (int *)&last_stack.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      script_sig.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_280,"psbt set witness script error.",
                 (allocator *)
                 ((long)&script_sig.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_280);
      script_sig.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::~ByteData((ByteData *)local_120);
  }
  locking_script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  local_7f9 = false;
  if ((redeem_script.script_stack_.
       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 1) != 0) {
    AbstractTxOut::GetLockingScript(&local_440,(AbstractTxOut *)&ret);
    locking_script.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    local_7f9 = Script::IsP2shScript(&local_440);
  }
  if ((locking_script.script_stack_.
       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    Script::~Script(&local_440);
  }
  if (local_7f9 != false) {
    Script::Script((Script *)local_480);
    if ((last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      bVar4 = Script::IsEmpty((Script *)
                              &utxo.super_AbstractTxOut.locking_script_.script_stack_.
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar4) {
        GetTxInKeyData((KeyData *)local_608,this,unlocking_script_local._4_4_,true);
        KeyData::GetPubkey((Pubkey *)
                           &builder.script_byte_array_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(KeyData *)local_608);
        ScriptUtil::CreateP2wpkhLockingScript
                  (&local_640,
                   (Pubkey *)
                   &builder.script_byte_array_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        Script::operator=((Script *)local_480,&local_640);
        Script::~Script(&local_640);
        Pubkey::~Pubkey((Pubkey *)
                        &builder.script_byte_array_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        KeyData::~KeyData((KeyData *)local_608);
      }
      else {
        Script::operator=((Script *)local_480,
                          (Script *)
                          &utxo.super_AbstractTxOut.locking_script_.script_stack_.
                           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    else {
      ScriptUtil::CreateP2wshLockingScript
                ((Script *)
                 &key.fingerprint_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (Script *)
                 &utxo.super_AbstractTxOut.locking_script_.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Script::operator=((Script *)local_480,
                        (Script *)
                        &key.fingerprint_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      Script::~Script((Script *)
                      &key.fingerprint_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    }
    ScriptBuilder::ScriptBuilder((ScriptBuilder *)local_678);
    Script::GetData((ByteData *)
                    &sig_val_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)local_480);
    ScriptBuilder::AppendData
              ((ScriptBuilder *)local_678,
               (ByteData *)
               &sig_val_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    ByteData::~ByteData((ByteData *)
                        &sig_val_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ScriptBuilder::Build(&local_6f8,(ScriptBuilder *)local_678);
    Script::GetData(&local_6c0,&local_6f8);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8,&local_6c0
                      );
    ByteData::~ByteData(&local_6c0);
    Script::~Script(&local_6f8);
    lVar1 = *(long *)((long)local_28 + 0x10);
    uVar11 = (ulong)unlocking_script_local._4_4_;
    puVar10 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8);
    sVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8);
    last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         wally_psbt_input_set_final_scriptsig(lVar1 + uVar11 * 0x110,puVar10,sVar7);
    if ((int)last_stack.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
      local_710.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_710.filename = local_710.filename + 1;
      local_710.line = 0x9d4;
      local_710.funcname = "SetTxInFinalScript";
      logger::warn<int&>(&local_710,"wally_psbt_input_set_final_scriptsig NG[{}]",
                         (int *)&last_stack.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_730,"psbt set scriptsig error.",&local_731);
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_730);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_6a8);
    ScriptBuilder::~ScriptBuilder((ScriptBuilder *)local_678);
    Script::~Script((Script *)local_480);
  }
  TxOut::~TxOut((TxOut *)&ret);
  Script::~Script((Script *)
                  &utxo.super_AbstractTxOut.locking_script_.script_stack_.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Psbt::SetTxInFinalScript(
    uint32_t index, const std::vector<ByteData> &unlocking_script) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  if (unlocking_script.empty()) {
    warn(CFD_LOG_SOURCE, "unlocking script is empty.");
    throw CfdException(
        kCfdIllegalArgumentError, "psbt unlocking script is empty.");
  }
  bool is_witness = false;
  auto redeem_script = GetTxInRedeemScript(index, true);

  auto utxo = GetTxInUtxo(index, true, &is_witness);
  bool is_wsh = false;
  int ret;
  if (is_witness) {
    auto last_stack = unlocking_script.back();
    if (redeem_script.GetData().Equals(last_stack)) {
      is_wsh = true;
    } else if (Pubkey::IsValid(last_stack)) {
      // p2wpkh
    } else {
      warn(CFD_LOG_SOURCE, "invalid unlocking_script.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid unlocking_script error.");
    }

    struct wally_tx_witness_stack *stacks = nullptr;
    ret = wally_tx_witness_stack_init_alloc(unlocking_script.size(), &stacks);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_tx_witness_stack_init_alloc NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt init witness stack error.");
    }
    for (auto script : unlocking_script) {
      auto script_val = script.GetBytes();
      ret = wally_tx_witness_stack_add(
          stacks, script_val.data(), script_val.size());
      if (ret != WALLY_OK) {
        wally_tx_witness_stack_free(stacks);
        warn(CFD_LOG_SOURCE, "wally_tx_witness_stack_add NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add witness stack error.");
      }
    }

    ret = wally_psbt_input_set_final_witness(
        &psbt_pointer->inputs[index], stacks);
    wally_tx_witness_stack_free(stacks);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_final_witness NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set witness script error.");
    }
  } else {
    Script script_sig;
    if (unlocking_script.size() == 1) {
      script_sig = Script(unlocking_script[0]);
    } else {
      ScriptBuilder build;
      for (auto script : unlocking_script) {
        auto script_val = script.GetBytes();
        if (script_val.size() == 1) {
          build.AppendOperator(static_cast<ScriptType>(script_val[0]));
        } else {
          build.AppendData(script);
        }
      }
      script_sig = build.Build();
    }
    auto sig_val = script_sig.GetData().GetBytes();
    ret = wally_psbt_input_set_final_scriptsig(
        &psbt_pointer->inputs[index], sig_val.data(), sig_val.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_final_scriptsig NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set scriptsig error.");
    }
  }

  if (is_witness && utxo.GetLockingScript().IsP2shScript()) {
    Script locking_script;
    if (is_wsh) {
      locking_script = ScriptUtil::CreateP2wshLockingScript(redeem_script);
    } else if (redeem_script.IsEmpty()) {
      auto key = GetTxInKeyData(index, true);
      locking_script = ScriptUtil::CreateP2wpkhLockingScript(key.GetPubkey());
    } else {
      locking_script = redeem_script;  // p2wpkh locking script
    }
    ScriptBuilder builder;
    builder.AppendData(locking_script.GetData());
    auto sig_val = builder.Build().GetData().GetBytes();
    ret = wally_psbt_input_set_final_scriptsig(
        &psbt_pointer->inputs[index], sig_val.data(), sig_val.size());
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_final_scriptsig NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt set scriptsig error.");
    }
  }
}